

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

string * deqp::gles3::Performance::anon_unknown_1::FunctionCase::sumExpr
                   (string *__return_storage_ptr__,string *aExpr,string *bExpr,DataType type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (type - TYPE_BOOL < 4) {
    if (type == TYPE_BOOL) {
      std::operator+(&local_38,"(",aExpr);
      std::operator+(&bStack_78,&local_38," == ");
      std::operator+(&local_58,&bStack_78,bExpr);
      std::operator+(__return_storage_ptr__,&local_58,")");
    }
    else {
      std::operator+(&local_38,"equal(",aExpr);
      std::operator+(&bStack_78,&local_38,", ");
      std::operator+(&local_58,&bStack_78,bExpr);
      std::operator+(__return_storage_ptr__,&local_58,")");
    }
  }
  else {
    std::operator+(&local_38,"(",aExpr);
    std::operator+(&bStack_78,&local_38," + ");
    std::operator+(&local_58,&bStack_78,bExpr);
    std::operator+(__return_storage_ptr__,&local_58,")");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string FunctionCase::sumExpr (const string& aExpr, const string& bExpr, glu::DataType type)
{
	if (glu::isDataTypeBoolOrBVec(type))
	{
		if (type == glu::TYPE_BOOL)
			return "(" + aExpr + " == " + bExpr + ")";
		else
			return "equal(" + aExpr + ", " + bExpr + ")";
	}
	else
		return "(" + aExpr + " + " + bExpr + ")";
}